

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::Options::parse_positional<char_const*>(Options *this,char *begin,char *end)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,begin,&local_69);
  std::__cxx11::string::string<std::allocator<char>>(local_30,end,&local_6a);
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l,&local_6b);
  parse_positional(this,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void
  parse_positional(Iterator begin, Iterator end) {
    parse_positional(std::vector<std::string>{begin, end});
  }